

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_fxstore(ASMState *as,IRIns *ir)

{
  byte bVar1;
  IRIns *pIVar2;
  MCode *pMVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  IRRef2 IVar7;
  long lVar8;
  RegSet RVar9;
  x86Op xo;
  bool bVar10;
  
  if ((ir->field_1).r == 0xfe) {
    return;
  }
  bVar4 = ((ir->field_1).t.irt & 0x1f) - 0xd;
  if ((5 < bVar4) || (IVar7 = 0, (0x33U >> (bVar4 & 0x1f) & 1) == 0)) {
    lVar8 = (long)(short)(ir->field_0).op2;
    if (lVar8 < 0) {
      IVar7 = 0;
      bVar10 = true;
    }
    else {
      pIVar2 = as->ir;
      if ((*(char *)((long)pIVar2 + lVar8 * 8 + 5) == '\x1b') ||
         ((0x605fd9U >> (*(uint *)((long)pIVar2 + lVar8 * 8 + 4) & 0x1f) & 1) == 0)) {
        IVar7 = pIVar2[lVar8].field_1.op12;
        bVar10 = false;
      }
      else {
        IVar7 = pIVar2[lVar8 + 1].i;
        bVar10 = (IRIns)(long)(int)IVar7 != pIVar2[lVar8 + 1];
        if (bVar10) {
          IVar7 = 0;
        }
      }
    }
    if (!bVar10) {
      RVar9 = 0xbfef;
      uVar5 = 0x80;
      goto LAB_001454e6;
    }
  }
  bVar1 = *(byte *)((long)as->ir + (ulong)(ir->field_0).op2 * 8 + 6);
  uVar5 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    RVar9 = 0xbfef;
    if (bVar4 < 2) {
      RVar9 = 0xffff0000;
    }
    uVar5 = ra_allocref(as,(uint)(ir->field_0).op2,RVar9);
  }
  bVar4 = (byte)uVar5 & 0x1f;
  as->weakset = as->weakset & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
  RVar9 = ~(1 << (uVar5 & 0x1f)) & 0xbfef;
LAB_001454e6:
  if ((ir->field_1).o == 'M') {
    asm_fusefref(as,as->ir + (ir->field_0).op1,RVar9);
  }
  else {
    asm_fusexref(as,(uint)(ir->field_0).op1,RVar9);
  }
  uVar6 = (ir->field_1).t.irt & 0x1f;
  if (uVar5 < 0x80) {
    switch(uVar6) {
    case 0xd:
      xo = XO_MOVSSto;
      break;
    case 0xe:
      xo = XO_MOVSDto;
      break;
    case 0xf:
    case 0x10:
      uVar5 = uVar5 | 0x200;
      xo = XO_MOVtob;
      break;
    case 0x11:
    case 0x12:
      xo = XO_MOVtow;
      break;
    default:
      if ((0x605fd9U >> uVar6 & 1) != 0) {
        uVar5 = uVar5 | 0x80200;
      }
      xo = XO_MOVto;
    }
  }
  else if ((byte)((char)uVar6 - 0xfU) < 2) {
    pMVar3 = as->mcp;
    as->mcp = pMVar3 + -1;
    pMVar3[-1] = (MCode)IVar7;
    xo = XO_MOVmib;
    uVar5 = 0;
  }
  else {
    pMVar3 = as->mcp;
    *(IRRef2 *)(pMVar3 + -4) = IVar7;
    as->mcp = pMVar3 + -4;
    uVar5._0_2_ = *(IROpT *)((long)ir + 4);
    uVar5._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar5 = -(uint)((0x605fd9U >> (uVar5 & 0x1f) & 1) != 0) & 0x80200;
    xo = XO_MOVmi;
  }
  emit_mrm(as,xo,uVar5,0x20);
  return;
}

Assistant:

static void asm_fxstore(ASMState *as, IRIns *ir)
{
  RegSet allow = RSET_GPR;
  Reg src = RID_NONE, osrc = RID_NONE;
  int32_t k = 0;
  if (ir->r == RID_SINK)
    return;
  /* The IRT_I16/IRT_U16 stores should never be simplified for constant
  ** values since mov word [mem], imm16 has a length-changing prefix.
  */
  if (irt_isi16(ir->t) || irt_isu16(ir->t) || irt_isfp(ir->t) ||
      !asm_isk32(as, ir->op2, &k)) {
    RegSet allow8 = irt_isfp(ir->t) ? RSET_FPR :
		    (irt_isi8(ir->t) || irt_isu8(ir->t)) ? RSET_GPR8 : RSET_GPR;
    src = osrc = ra_alloc1(as, ir->op2, allow8);
    if (!LJ_64 && !rset_test(allow8, src)) {  /* Already in wrong register. */
      rset_clear(allow, osrc);
      src = ra_scratch(as, allow8);
    }
    rset_clear(allow, src);
  }
  if (ir->o == IR_FSTORE) {
    asm_fusefref(as, IR(ir->op1), allow);
  } else {
    asm_fusexref(as, ir->op1, allow);
    if (LJ_32 && ir->o == IR_HIOP) as->mrm.ofs += 4;
  }
  if (ra_hasreg(src)) {
    x86Op xo;
    switch (irt_type(ir->t)) {
    case IRT_I8: case IRT_U8: xo = XO_MOVtob; src |= FORCE_REX; break;
    case IRT_I16: case IRT_U16: xo = XO_MOVtow; break;
    case IRT_NUM: xo = XO_MOVSDto; break;
    case IRT_FLOAT: xo = XO_MOVSSto; break;
#if LJ_64 && !LJ_GC64
    case IRT_LIGHTUD:
      /* NYI: mask 64 bit lightuserdata. */
      lj_assertA(0, "store of lightuserdata");
#endif
    default:
      if (LJ_64 && irt_is64(ir->t))
	src |= REX_64;
      else
	lj_assertA(irt_isint(ir->t) || irt_isu32(ir->t) || irt_isaddr(ir->t),
		   "unsplit 64 bit store");
      xo = XO_MOVto;
      break;
    }
    emit_mrm(as, xo, src, RID_MRM);
    if (!LJ_64 && src != osrc) {
      ra_noweak(as, osrc);
      emit_rr(as, XO_MOV, src, osrc);
    }
  } else {
    if (irt_isi8(ir->t) || irt_isu8(ir->t)) {
      emit_i8(as, k);
      emit_mrm(as, XO_MOVmib, 0, RID_MRM);
    } else {
      lj_assertA(irt_is64(ir->t) || irt_isint(ir->t) || irt_isu32(ir->t) ||
		 irt_isaddr(ir->t), "bad store type");
      emit_i32(as, k);
      emit_mrm(as, XO_MOVmi, REX_64IR(ir, 0), RID_MRM);
    }
  }
}